

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  undefined4 uVar14;
  size_t sVar15;
  undefined8 uVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  AABBNodeMB4D *node1;
  ulong uVar29;
  Geometry *pGVar30;
  long lVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  Geometry *pGVar36;
  ulong uVar37;
  ulong uVar38;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar39;
  ulong uVar40;
  long lVar41;
  undefined4 uVar42;
  ulong unaff_R13;
  ulong uVar43;
  long lVar44;
  float fVar45;
  float fVar58;
  float fVar59;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar60;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar57;
  float fVar61;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar70;
  float fVar77;
  float fVar78;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar73;
  float fVar79;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar85;
  float fVar86;
  undefined1 auVar81 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar82;
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar97;
  float fVar98;
  uint uVar99;
  float fVar102;
  uint uVar103;
  float fVar104;
  uint uVar105;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar106;
  uint uVar107;
  float fVar108;
  float fVar110;
  float fVar112;
  float fVar113;
  undefined1 auVar109 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  int iVar139;
  int iVar140;
  int iVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  vbool<4> valid;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  long local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  ulong local_1198;
  StackItemT<embree::NodeRefPtr<4>_> *local_1190;
  Scene *local_1188;
  undefined8 *local_1180;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  float local_10e8 [4];
  float local_10d8 [4];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  float local_1098 [4];
  undefined1 local_1088 [16];
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float fVar111;
  
  pSVar39 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  local_1018 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_1028 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1038 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1048 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1058 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1068 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar38 = uVar33 ^ 0x10;
  uVar43 = uVar34 ^ 0x10;
  uVar40 = uVar37 ^ 0x10;
  local_1078 = (tray->tnear).field_0.i[k];
  iVar28 = (tray->tfar).field_0.i[k];
  auVar62._4_4_ = iVar28;
  auVar62._0_4_ = iVar28;
  auVar62._8_4_ = iVar28;
  auVar62._12_4_ = iVar28;
  local_1180 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  fStack_1054 = local_1058;
  fStack_1050 = local_1058;
  fStack_104c = local_1058;
  fStack_1064 = local_1068;
  fStack_1060 = local_1068;
  fStack_105c = local_1068;
  iStack_1074 = local_1078;
  iStack_1070 = local_1078;
  iStack_106c = local_1078;
  fVar127 = local_1018;
  fVar111 = local_1018;
  fVar121 = local_1018;
  fVar128 = local_1018;
  fVar45 = local_1028;
  fVar58 = local_1028;
  fVar59 = local_1028;
  fVar60 = local_1028;
  fVar61 = local_1038;
  fVar67 = local_1038;
  fVar68 = local_1038;
  fVar69 = local_1038;
  fVar70 = local_1048;
  fVar77 = local_1048;
  fVar78 = local_1048;
  fVar79 = local_1048;
  fVar80 = local_1058;
  fVar85 = local_1058;
  fVar86 = local_1058;
  fVar87 = local_1058;
  fVar98 = local_1068;
  fVar102 = local_1068;
  fVar104 = local_1068;
  fVar106 = local_1068;
  iVar28 = local_1078;
  iVar139 = local_1078;
  iVar140 = local_1078;
  iVar141 = local_1078;
  do {
    do {
      do {
        if (pSVar39 == stack) {
          return;
        }
        pSVar25 = pSVar39 + -1;
        pSVar39 = pSVar39 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar25->dist &&
               (float)pSVar25->dist != *(float *)(ray + k * 4 + 0x80));
      sVar32 = (pSVar39->ptr).ptr;
      do {
        if ((sVar32 & 8) == 0) {
          uVar29 = sVar32 & 0xfffffffffffffff0;
          fVar108 = *(float *)(ray + k * 4 + 0x70);
          pfVar3 = (float *)(uVar29 + 0x80 + uVar33);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar33);
          auVar88._0_4_ = ((*pfVar3 * fVar108 + *pfVar1) - fVar127) * fVar70;
          auVar88._4_4_ = ((pfVar3[1] * fVar108 + pfVar1[1]) - fVar111) * fVar77;
          auVar88._8_4_ = ((pfVar3[2] * fVar108 + pfVar1[2]) - fVar121) * fVar78;
          auVar88._12_4_ = ((pfVar3[3] * fVar108 + pfVar1[3]) - fVar128) * fVar79;
          auVar71._4_4_ = iVar139;
          auVar71._0_4_ = iVar28;
          auVar71._8_4_ = iVar140;
          auVar71._12_4_ = iVar141;
          pfVar3 = (float *)(uVar29 + 0x80 + uVar34);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar34);
          auVar71 = maxps(auVar71,auVar88);
          auVar101._0_4_ = ((*pfVar3 * fVar108 + *pfVar1) - fVar45) * fVar80;
          auVar101._4_4_ = ((pfVar3[1] * fVar108 + pfVar1[1]) - fVar58) * fVar85;
          auVar101._8_4_ = ((pfVar3[2] * fVar108 + pfVar1[2]) - fVar59) * fVar86;
          auVar101._12_4_ = ((pfVar3[3] * fVar108 + pfVar1[3]) - fVar60) * fVar87;
          pfVar3 = (float *)(uVar29 + 0x80 + uVar37);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar37);
          auVar95._0_4_ = ((*pfVar3 * fVar108 + *pfVar1) - fVar61) * fVar98;
          auVar95._4_4_ = ((pfVar3[1] * fVar108 + pfVar1[1]) - fVar67) * fVar102;
          auVar95._8_4_ = ((pfVar3[2] * fVar108 + pfVar1[2]) - fVar68) * fVar104;
          auVar95._12_4_ = ((pfVar3[3] * fVar108 + pfVar1[3]) - fVar69) * fVar106;
          auVar88 = maxps(auVar101,auVar95);
          tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar71,auVar88);
          pfVar4 = (float *)(uVar29 + 0x80 + uVar38);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar38);
          pfVar5 = (float *)(uVar29 + 0x80 + uVar43);
          pfVar3 = (float *)(uVar29 + 0x20 + uVar43);
          auVar89._0_4_ = ((*pfVar4 * fVar108 + *pfVar1) - fVar127) * fVar70;
          auVar89._4_4_ = ((pfVar4[1] * fVar108 + pfVar1[1]) - fVar111) * fVar77;
          auVar89._8_4_ = ((pfVar4[2] * fVar108 + pfVar1[2]) - fVar121) * fVar78;
          auVar89._12_4_ = ((pfVar4[3] * fVar108 + pfVar1[3]) - fVar128) * fVar79;
          auVar93._0_4_ = ((*pfVar5 * fVar108 + *pfVar3) - fVar45) * fVar80;
          auVar93._4_4_ = ((pfVar5[1] * fVar108 + pfVar3[1]) - fVar58) * fVar85;
          auVar93._8_4_ = ((pfVar5[2] * fVar108 + pfVar3[2]) - fVar59) * fVar86;
          auVar93._12_4_ = ((pfVar5[3] * fVar108 + pfVar3[3]) - fVar60) * fVar87;
          pfVar3 = (float *)(uVar29 + 0x80 + uVar40);
          pfVar1 = (float *)(uVar29 + 0x20 + uVar40);
          auVar96._0_4_ = ((*pfVar3 * fVar108 + *pfVar1) - fVar61) * fVar98;
          auVar96._4_4_ = ((pfVar3[1] * fVar108 + pfVar1[1]) - fVar67) * fVar102;
          auVar96._8_4_ = ((pfVar3[2] * fVar108 + pfVar1[2]) - fVar68) * fVar104;
          auVar96._12_4_ = ((pfVar3[3] * fVar108 + pfVar1[3]) - fVar69) * fVar106;
          auVar88 = minps(auVar93,auVar96);
          auVar71 = minps(auVar62,auVar89);
          auVar71 = minps(auVar71,auVar88);
          if (((uint)sVar32 & 7) == 6) {
            bVar18 = (fVar108 < *(float *)(uVar29 + 0xf0) && *(float *)(uVar29 + 0xe0) <= fVar108)
                     && tNear.field_0._0_4_ <= auVar71._0_4_;
            bVar19 = (fVar108 < *(float *)(uVar29 + 0xf4) && *(float *)(uVar29 + 0xe4) <= fVar108)
                     && tNear.field_0._4_4_ <= auVar71._4_4_;
            bVar20 = (fVar108 < *(float *)(uVar29 + 0xf8) && *(float *)(uVar29 + 0xe8) <= fVar108)
                     && tNear.field_0._8_4_ <= auVar71._8_4_;
            bVar21 = (fVar108 < *(float *)(uVar29 + 0xfc) && *(float *)(uVar29 + 0xec) <= fVar108)
                     && tNear.field_0._12_4_ <= auVar71._12_4_;
          }
          else {
            bVar18 = tNear.field_0._0_4_ <= auVar71._0_4_;
            bVar19 = tNear.field_0._4_4_ <= auVar71._4_4_;
            bVar20 = tNear.field_0._8_4_ <= auVar71._8_4_;
            bVar21 = tNear.field_0._12_4_ <= auVar71._12_4_;
          }
          auVar46._0_4_ = (uint)bVar18 * -0x80000000;
          auVar46._4_4_ = (uint)bVar19 * -0x80000000;
          auVar46._8_4_ = (uint)bVar20 * -0x80000000;
          auVar46._12_4_ = (uint)bVar21 * -0x80000000;
          uVar42 = movmskps((int)unaff_R13,auVar46);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar42);
        }
        if ((sVar32 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar26 = 4;
          }
          else {
            uVar29 = sVar32 & 0xfffffffffffffff0;
            lVar31 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            iVar26 = 0;
            sVar32 = *(size_t *)(uVar29 + lVar31 * 8);
            uVar35 = unaff_R13 - 1 & unaff_R13;
            if (uVar35 != 0) {
              uVar27 = tNear.field_0.i[lVar31];
              lVar31 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                }
              }
              sVar15 = *(size_t *)(uVar29 + lVar31 * 8);
              uVar99 = tNear.field_0.i[lVar31];
              uVar35 = uVar35 - 1 & uVar35;
              if (uVar35 == 0) {
                if (uVar27 < uVar99) {
                  (pSVar39->ptr).ptr = sVar15;
                  pSVar39->dist = uVar99;
                  pSVar39 = pSVar39 + 1;
                }
                else {
                  (pSVar39->ptr).ptr = sVar32;
                  pSVar39->dist = uVar27;
                  sVar32 = sVar15;
                  pSVar39 = pSVar39 + 1;
                }
              }
              else {
                auVar72._8_4_ = uVar27;
                auVar72._0_8_ = sVar32;
                auVar72._12_4_ = 0;
                auVar90._8_4_ = uVar99;
                auVar90._0_8_ = sVar15;
                auVar90._12_4_ = 0;
                lVar31 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
                uVar16 = *(undefined8 *)(uVar29 + lVar31 * 8);
                iVar13 = tNear.field_0.i[lVar31];
                auVar81._8_4_ = iVar13;
                auVar81._0_8_ = uVar16;
                auVar81._12_4_ = 0;
                auVar47._8_4_ = -(uint)((int)uVar27 < (int)uVar99);
                uVar35 = uVar35 - 1 & uVar35;
                if (uVar35 == 0) {
                  auVar47._4_4_ = auVar47._8_4_;
                  auVar47._0_4_ = auVar47._8_4_;
                  auVar47._12_4_ = auVar47._8_4_;
                  auVar94._8_4_ = uVar99;
                  auVar94._0_8_ = sVar15;
                  auVar94._12_4_ = 0;
                  auVar95 = blendvps(auVar94,auVar72,auVar47);
                  auVar71 = blendvps(auVar72,auVar90,auVar47);
                  auVar48._8_4_ = -(uint)(auVar95._8_4_ < iVar13);
                  auVar48._4_4_ = auVar48._8_4_;
                  auVar48._0_4_ = auVar48._8_4_;
                  auVar48._12_4_ = auVar48._8_4_;
                  auVar91._8_4_ = iVar13;
                  auVar91._0_8_ = uVar16;
                  auVar91._12_4_ = 0;
                  auVar88 = blendvps(auVar91,auVar95,auVar48);
                  auVar95 = blendvps(auVar95,auVar81,auVar48);
                  auVar49._8_4_ = -(uint)(auVar71._8_4_ < auVar95._8_4_);
                  auVar49._4_4_ = auVar49._8_4_;
                  auVar49._0_4_ = auVar49._8_4_;
                  auVar49._12_4_ = auVar49._8_4_;
                  SVar82 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar95,auVar71,auVar49);
                  SVar73 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar71,auVar95,auVar49);
                  *pSVar39 = SVar73;
                  pSVar39[1] = SVar82;
                  sVar32 = auVar88._0_8_;
                  pSVar39 = pSVar39 + 2;
                }
                else {
                  lVar31 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                    }
                  }
                  auVar50._4_4_ = auVar47._8_4_;
                  auVar50._0_4_ = auVar47._8_4_;
                  auVar50._8_4_ = auVar47._8_4_;
                  auVar50._12_4_ = auVar47._8_4_;
                  auVar96 = blendvps(auVar90,auVar72,auVar50);
                  auVar71 = blendvps(auVar72,auVar90,auVar50);
                  auVar100._8_4_ = tNear.field_0.i[lVar31];
                  auVar100._0_8_ = *(undefined8 *)(uVar29 + lVar31 * 8);
                  auVar100._12_4_ = 0;
                  auVar51._8_4_ = -(uint)(iVar13 < tNear.field_0.i[lVar31]);
                  auVar51._4_4_ = auVar51._8_4_;
                  auVar51._0_4_ = auVar51._8_4_;
                  auVar51._12_4_ = auVar51._8_4_;
                  auVar95 = blendvps(auVar100,auVar81,auVar51);
                  auVar88 = blendvps(auVar81,auVar100,auVar51);
                  auVar52._8_4_ = -(uint)(auVar71._8_4_ < auVar88._8_4_);
                  auVar52._4_4_ = auVar52._8_4_;
                  auVar52._0_4_ = auVar52._8_4_;
                  auVar52._12_4_ = auVar52._8_4_;
                  auVar101 = blendvps(auVar88,auVar71,auVar52);
                  SVar73 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar71,auVar88,auVar52);
                  auVar53._8_4_ = -(uint)(auVar96._8_4_ < auVar95._8_4_);
                  auVar53._4_4_ = auVar53._8_4_;
                  auVar53._0_4_ = auVar53._8_4_;
                  auVar53._12_4_ = auVar53._8_4_;
                  auVar71 = blendvps(auVar95,auVar96,auVar53);
                  auVar88 = blendvps(auVar96,auVar95,auVar53);
                  auVar54._8_4_ = -(uint)(auVar88._8_4_ < auVar101._8_4_);
                  auVar54._4_4_ = auVar54._8_4_;
                  auVar54._0_4_ = auVar54._8_4_;
                  auVar54._12_4_ = auVar54._8_4_;
                  SVar82 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar101,auVar88,auVar54);
                  SVar97 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar88,auVar101,auVar54);
                  *pSVar39 = SVar73;
                  pSVar39[1] = SVar97;
                  pSVar39[2] = SVar82;
                  sVar32 = auVar71._0_8_;
                  pSVar39 = pSVar39 + 3;
                }
              }
            }
          }
        }
        else {
          iVar26 = 6;
        }
      } while (iVar26 == 0);
    } while (iVar26 != 6);
    lVar31 = (ulong)((uint)sVar32 & 0xf) - 8;
    if (lVar31 != 0) {
      uVar29 = sVar32 & 0xfffffffffffffff0;
      lVar41 = 0;
      uVar27 = 6;
      do {
        lVar44 = lVar41 * 0x140;
        fVar127 = *(float *)(ray + k * 4 + 0x70);
        pfVar3 = (float *)(uVar29 + 0x90 + lVar44);
        pfVar1 = (float *)(uVar29 + lVar44);
        fVar80 = *pfVar3 * fVar127 + *pfVar1;
        fVar85 = pfVar3[1] * fVar127 + pfVar1[1];
        fVar86 = pfVar3[2] * fVar127 + pfVar1[2];
        fVar87 = pfVar3[3] * fVar127 + pfVar1[3];
        pfVar3 = (float *)(uVar29 + 0xa0 + lVar44);
        pfVar1 = (float *)(uVar29 + 0x10 + lVar44);
        fVar70 = *pfVar3 * fVar127 + *pfVar1;
        fVar77 = pfVar3[1] * fVar127 + pfVar1[1];
        fVar78 = pfVar3[2] * fVar127 + pfVar1[2];
        fVar79 = pfVar3[3] * fVar127 + pfVar1[3];
        pfVar3 = (float *)(uVar29 + 0xb0 + lVar44);
        pfVar1 = (float *)(uVar29 + 0x20 + lVar44);
        fVar45 = *pfVar3 * fVar127 + *pfVar1;
        fVar58 = pfVar3[1] * fVar127 + pfVar1[1];
        fVar59 = pfVar3[2] * fVar127 + pfVar1[2];
        fVar60 = pfVar3[3] * fVar127 + pfVar1[3];
        pfVar6 = (float *)(uVar29 + 0xc0 + lVar44);
        pfVar1 = (float *)(uVar29 + 0x30 + lVar44);
        pfVar7 = (float *)(uVar29 + 0xd0 + lVar44);
        pfVar3 = (float *)(uVar29 + 0x40 + lVar44);
        pfVar8 = (float *)(uVar29 + 0xe0 + lVar44);
        pfVar4 = (float *)(uVar29 + 0x50 + lVar44);
        pfVar9 = (float *)(uVar29 + 0xf0 + lVar44);
        pfVar5 = (float *)(uVar29 + 0x60 + lVar44);
        pfVar10 = (float *)(uVar29 + 0x100 + lVar44);
        pfVar2 = (float *)(uVar29 + 0x70 + lVar44);
        pfVar11 = (float *)(uVar29 + 0x110 + lVar44);
        pfVar12 = (float *)(uVar29 + 0x80 + lVar44);
        fVar114 = fVar80 - (*pfVar6 * fVar127 + *pfVar1);
        fVar115 = fVar85 - (pfVar6[1] * fVar127 + pfVar1[1]);
        fVar116 = fVar86 - (pfVar6[2] * fVar127 + pfVar1[2]);
        fVar117 = fVar87 - (pfVar6[3] * fVar127 + pfVar1[3]);
        fVar122 = fVar70 - (*pfVar7 * fVar127 + *pfVar3);
        fVar123 = fVar77 - (pfVar7[1] * fVar127 + pfVar3[1]);
        fVar124 = fVar78 - (pfVar7[2] * fVar127 + pfVar3[2]);
        fVar125 = fVar79 - (pfVar7[3] * fVar127 + pfVar3[3]);
        fVar126 = fVar45 - (*pfVar8 * fVar127 + *pfVar4);
        fVar129 = fVar58 - (pfVar8[1] * fVar127 + pfVar4[1]);
        fVar131 = fVar59 - (pfVar8[2] * fVar127 + pfVar4[2]);
        fVar133 = fVar60 - (pfVar8[3] * fVar127 + pfVar4[3]);
        fVar61 = (*pfVar9 * fVar127 + *pfVar5) - fVar80;
        fVar67 = (pfVar9[1] * fVar127 + pfVar5[1]) - fVar85;
        fVar68 = (pfVar9[2] * fVar127 + pfVar5[2]) - fVar86;
        fVar69 = (pfVar9[3] * fVar127 + pfVar5[3]) - fVar87;
        fVar108 = (*pfVar10 * fVar127 + *pfVar2) - fVar70;
        fVar110 = (pfVar10[1] * fVar127 + pfVar2[1]) - fVar77;
        fVar112 = (pfVar10[2] * fVar127 + pfVar2[2]) - fVar78;
        fVar113 = (pfVar10[3] * fVar127 + pfVar2[3]) - fVar79;
        fVar98 = (fVar127 * *pfVar11 + *pfVar12) - fVar45;
        fVar102 = (fVar127 * pfVar11[1] + pfVar12[1]) - fVar58;
        fVar104 = (fVar127 * pfVar11[2] + pfVar12[2]) - fVar59;
        fVar106 = (fVar127 * pfVar11[3] + pfVar12[3]) - fVar60;
        local_10b8._0_4_ = fVar126 * fVar108 - fVar122 * fVar98;
        local_10b8._4_4_ = fVar129 * fVar110 - fVar123 * fVar102;
        local_10b8._8_4_ = fVar131 * fVar112 - fVar124 * fVar104;
        local_10b8._12_4_ = fVar133 * fVar113 - fVar125 * fVar106;
        fVar127 = *(float *)(ray + k * 4);
        fVar111 = *(float *)(ray + k * 4 + 0x10);
        fVar121 = *(float *)(ray + k * 4 + 0x40);
        fVar128 = *(float *)(ray + k * 4 + 0x50);
        fVar80 = fVar80 - fVar127;
        fVar85 = fVar85 - fVar127;
        fVar86 = fVar86 - fVar127;
        fVar87 = fVar87 - fVar127;
        fVar70 = fVar70 - fVar111;
        fVar77 = fVar77 - fVar111;
        fVar78 = fVar78 - fVar111;
        fVar79 = fVar79 - fVar111;
        fVar135 = fVar80 * fVar128 - fVar70 * fVar121;
        fVar136 = fVar85 * fVar128 - fVar77 * fVar121;
        fVar137 = fVar86 * fVar128 - fVar78 * fVar121;
        fVar138 = fVar87 * fVar128 - fVar79 * fVar121;
        local_10a8._0_4_ = fVar114 * fVar98 - fVar126 * fVar61;
        local_10a8._4_4_ = fVar115 * fVar102 - fVar129 * fVar67;
        local_10a8._8_4_ = fVar116 * fVar104 - fVar131 * fVar68;
        local_10a8._12_4_ = fVar117 * fVar106 - fVar133 * fVar69;
        fVar127 = *(float *)(ray + k * 4 + 0x20);
        fVar111 = *(float *)(ray + k * 4 + 0x60);
        fVar45 = fVar45 - fVar127;
        fVar58 = fVar58 - fVar127;
        fVar59 = fVar59 - fVar127;
        fVar60 = fVar60 - fVar127;
        fVar142 = fVar45 * fVar121 - fVar80 * fVar111;
        fVar143 = fVar58 * fVar121 - fVar85 * fVar111;
        fVar144 = fVar59 * fVar121 - fVar86 * fVar111;
        fVar145 = fVar60 * fVar121 - fVar87 * fVar111;
        local_1098[0] = fVar122 * fVar61 - fVar114 * fVar108;
        local_1098[1] = fVar123 * fVar67 - fVar115 * fVar110;
        local_1098[2] = fVar124 * fVar68 - fVar116 * fVar112;
        local_1098[3] = fVar125 * fVar69 - fVar117 * fVar113;
        fVar127 = fVar70 * fVar111 - fVar45 * fVar128;
        fVar130 = fVar77 * fVar111 - fVar58 * fVar128;
        fVar132 = fVar78 * fVar111 - fVar59 * fVar128;
        fVar134 = fVar79 * fVar111 - fVar60 * fVar128;
        fVar118 = fVar121 * local_10b8._0_4_ + fVar128 * local_10a8._0_4_ + fVar111 * local_1098[0];
        fVar119 = fVar121 * local_10b8._4_4_ + fVar128 * local_10a8._4_4_ + fVar111 * local_1098[1];
        fVar120 = fVar121 * local_10b8._8_4_ + fVar128 * local_10a8._8_4_ + fVar111 * local_1098[2];
        fVar121 = fVar121 * local_10b8._12_4_ +
                  fVar128 * local_10a8._12_4_ + fVar111 * local_1098[3];
        uVar99 = (uint)fVar118 & 0x80000000;
        uVar103 = (uint)fVar119 & 0x80000000;
        uVar105 = (uint)fVar120 & 0x80000000;
        uVar107 = (uint)fVar121 & 0x80000000;
        tNear.field_0._0_4_ =
             (float)((uint)(fVar61 * fVar127 + fVar108 * fVar142 + fVar98 * fVar135) ^ uVar99);
        tNear.field_0._4_4_ =
             (float)((uint)(fVar67 * fVar130 + fVar110 * fVar143 + fVar102 * fVar136) ^ uVar103);
        tNear.field_0._8_4_ =
             (float)((uint)(fVar68 * fVar132 + fVar112 * fVar144 + fVar104 * fVar137) ^ uVar105);
        tNear.field_0._12_4_ =
             (float)((uint)(fVar69 * fVar134 + fVar113 * fVar145 + fVar106 * fVar138) ^ uVar107);
        fVar128 = (float)((uint)(fVar127 * fVar114 + fVar142 * fVar122 + fVar135 * fVar126) ^ uVar99
                         );
        fVar61 = (float)((uint)(fVar130 * fVar115 + fVar143 * fVar123 + fVar136 * fVar129) ^ uVar103
                        );
        fVar67 = (float)((uint)(fVar132 * fVar116 + fVar144 * fVar124 + fVar137 * fVar131) ^ uVar105
                        );
        fVar68 = (float)((uint)(fVar134 * fVar117 + fVar145 * fVar125 + fVar138 * fVar133) ^ uVar107
                        );
        fVar127 = ABS(fVar118);
        fVar111 = ABS(fVar119);
        auVar109._0_8_ = CONCAT44(fVar119,fVar118) & 0x7fffffff7fffffff;
        auVar109._8_4_ = ABS(fVar120);
        auVar109._12_4_ = ABS(fVar121);
        bVar20 = ((0.0 <= fVar128 && 0.0 <= tNear.field_0._0_4_) && fVar118 != 0.0) &&
                 tNear.field_0._0_4_ + fVar128 <= fVar127;
        bVar21 = ((0.0 <= fVar61 && 0.0 <= tNear.field_0._4_4_) && fVar119 != 0.0) &&
                 tNear.field_0._4_4_ + fVar61 <= fVar111;
        bVar19 = ((0.0 <= fVar67 && 0.0 <= tNear.field_0._8_4_) && fVar120 != 0.0) &&
                 tNear.field_0._8_4_ + fVar67 <= auVar109._8_4_;
        bVar18 = ((0.0 <= fVar68 && 0.0 <= tNear.field_0._12_4_) && fVar121 != 0.0) &&
                 tNear.field_0._12_4_ + fVar68 <= auVar109._12_4_;
        auVar22._4_4_ = -(uint)bVar21;
        auVar22._0_4_ = -(uint)bVar20;
        auVar22._8_4_ = -(uint)bVar19;
        auVar22._12_4_ = -(uint)bVar18;
        uVar27 = movmskps(uVar27,auVar22);
        if (uVar27 != 0) {
          fVar69 = (float)(uVar99 ^ (uint)(fVar80 * local_10b8._0_4_ +
                                          fVar70 * local_10a8._0_4_ + fVar45 * local_1098[0]));
          fVar58 = (float)(uVar103 ^
                          (uint)(fVar85 * local_10b8._4_4_ +
                                fVar77 * local_10a8._4_4_ + fVar58 * local_1098[1]));
          fVar59 = (float)(uVar105 ^
                          (uint)(fVar86 * local_10b8._8_4_ +
                                fVar78 * local_10a8._8_4_ + fVar59 * local_1098[2]));
          fVar60 = (float)(uVar107 ^
                          (uint)(fVar87 * local_10b8._12_4_ +
                                fVar79 * local_10a8._12_4_ + fVar60 * local_1098[3]));
          fVar121 = *(float *)(ray + k * 4 + 0x30);
          fVar45 = *(float *)(ray + k * 4 + 0x80);
          valid.field_0.i[0] =
               -(uint)((fVar69 <= fVar45 * fVar127 && fVar121 * fVar127 < fVar69) && bVar20);
          valid.field_0.i[1] =
               -(uint)((fVar58 <= fVar45 * fVar111 && fVar121 * fVar111 < fVar58) && bVar21);
          valid.field_0.i[2] =
               -(uint)((fVar59 <= fVar45 * auVar109._8_4_ && fVar121 * auVar109._8_4_ < fVar59) &&
                      bVar19);
          valid.field_0.i[3] =
               -(uint)((fVar60 <= fVar45 * auVar109._12_4_ && fVar121 * auVar109._12_4_ < fVar60) &&
                      bVar18);
          uVar27 = movmskps(uVar27,(undefined1  [16])valid.field_0);
          if (uVar27 != 0) {
            local_1188 = context->scene;
            auVar62 = rcpps((undefined1  [16])tNear.field_0,auVar109);
            fVar121 = auVar62._0_4_;
            fVar45 = auVar62._4_4_;
            fVar70 = auVar62._8_4_;
            fVar77 = auVar62._12_4_;
            fVar121 = (1.0 - fVar127 * fVar121) * fVar121 + fVar121;
            fVar45 = (1.0 - fVar111 * fVar45) * fVar45 + fVar45;
            fVar70 = (1.0 - auVar109._8_4_ * fVar70) * fVar70 + fVar70;
            fVar77 = (1.0 - auVar109._12_4_ * fVar77) * fVar77 + fVar77;
            auVar92._0_4_ = fVar69 * fVar121;
            auVar92._4_4_ = fVar58 * fVar45;
            auVar92._8_4_ = fVar59 * fVar70;
            auVar92._12_4_ = fVar60 * fVar77;
            local_10c8 = auVar92;
            local_10e8[0] = tNear.field_0._0_4_ * fVar121;
            local_10e8[1] = tNear.field_0._4_4_ * fVar45;
            local_10e8[2] = tNear.field_0._8_4_ * fVar70;
            local_10e8[3] = tNear.field_0._12_4_ * fVar77;
            local_10d8[0] = fVar121 * fVar128;
            local_10d8[1] = fVar45 * fVar61;
            local_10d8[2] = fVar70 * fVar67;
            local_10d8[3] = fVar77 * fVar68;
            auVar71 = blendvps(_DAT_01feb9f0,auVar92,(undefined1  [16])valid.field_0);
            auVar83._4_4_ = auVar71._0_4_;
            auVar83._0_4_ = auVar71._4_4_;
            auVar83._8_4_ = auVar71._12_4_;
            auVar83._12_4_ = auVar71._8_4_;
            auVar62 = minps(auVar83,auVar71);
            auVar63._0_8_ = auVar62._8_8_;
            auVar63._8_4_ = auVar62._0_4_;
            auVar63._12_4_ = auVar62._4_4_;
            auVar62 = minps(auVar63,auVar62);
            uVar27 = -(uint)(auVar62._0_4_ == auVar71._0_4_);
            uVar99 = -(uint)(auVar62._4_4_ == auVar71._4_4_);
            uVar103 = -(uint)(auVar62._8_4_ == auVar71._8_4_);
            uVar105 = -(uint)(auVar62._12_4_ == auVar71._12_4_);
            auVar76._4_4_ = uVar99;
            auVar76._0_4_ = uVar27;
            auVar74._0_4_ = uVar27 & valid.field_0.i[0];
            auVar74._4_4_ = uVar99 & valid.field_0.i[1];
            auVar74._8_4_ = uVar103 & valid.field_0.i[2];
            auVar74._12_4_ = uVar105 & valid.field_0.i[3];
            iVar28 = movmskps((int)context,auVar74);
            auVar75._8_4_ = 0xffffffff;
            auVar75._0_8_ = 0xffffffffffffffff;
            auVar75._12_4_ = 0xffffffff;
            if (iVar28 != 0) {
              auVar76._8_4_ = uVar103;
              auVar76._12_4_ = uVar105;
              auVar75 = auVar76;
            }
            lVar44 = lVar44 + uVar29;
            auVar55._0_4_ = valid.field_0.i[0] & auVar75._0_4_;
            auVar55._4_4_ = valid.field_0.i[1] & auVar75._4_4_;
            auVar55._8_4_ = valid.field_0.i[2] & auVar75._8_4_;
            auVar55._12_4_ = valid.field_0.i[3] & auVar75._12_4_;
            uVar42 = movmskps(iVar28,auVar55);
            uVar35 = CONCAT44((int)((ulong)context >> 0x20),uVar42);
            pGVar36 = (Geometry *)0x0;
            if (uVar35 != 0) {
              for (; (uVar35 >> (long)pGVar36 & 1) == 0;
                  pGVar36 = (Geometry *)((long)&(pGVar36->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
LAB_00273766:
            h.geomID.field_0.i[0] = *(uint *)(lVar44 + 0x120 + (long)pGVar36 * 4);
            pGVar30 = (local_1188->geometries).items[h.geomID.field_0.i[0]].ptr;
            if ((pGVar30->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[(long)pGVar36] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar127 = local_10e8[(long)pGVar36];
                fVar111 = local_10d8[(long)pGVar36];
                *(undefined4 *)(ray + k * 4 + 0x80) =
                     *(undefined4 *)(local_10c8 + (long)pGVar36 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) =
                     *(undefined4 *)(local_10b8 + (long)pGVar36 * 4);
                *(float *)(ray + k * 4 + 0xd0) = local_1098[(long)&pGVar36[-1].field_0x5c];
                *(float *)(ray + k * 4 + 0xe0) = local_1098[(long)pGVar36];
                *(float *)(ray + k * 4 + 0xf0) = fVar127;
                *(float *)(ray + k * 4 + 0x100) = fVar111;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)(lVar44 + 0x130 + (long)pGVar36 * 4);
                *(undefined4 *)(ray + k * 4 + 0x120) = h.geomID.field_0.i[0];
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar27 = context->user->instPrimID[0];
                *(uint *)(ray + k * 4 + 0x140) = uVar27;
                goto LAB_0027361a;
              }
              local_1088 = auVar92;
              h.u.field_0.v[0] = local_10e8[(long)pGVar36];
              h.v.field_0.v[0] = local_10d8[(long)pGVar36];
              uVar42 = *(undefined4 *)(local_10b8 + (long)pGVar36 * 4);
              fVar127 = local_1098[(long)&pGVar36[-1].field_0x5c];
              uVar14 = *(undefined4 *)(lVar44 + 0x130 + (long)pGVar36 * 4);
              h.primID.field_0.i[1] = uVar14;
              h.primID.field_0.i[0] = uVar14;
              h.primID.field_0.i[2] = uVar14;
              h.primID.field_0.i[3] = uVar14;
              h.Ng.field_0._4_4_ = uVar42;
              h.Ng.field_0._0_4_ = uVar42;
              h.Ng.field_0._8_4_ = uVar42;
              h.Ng.field_0._12_4_ = uVar42;
              h.Ng.field_0._20_4_ = (int)fVar127;
              h.Ng.field_0._16_4_ = (int)fVar127;
              h.Ng.field_0._24_4_ = (int)fVar127;
              h.Ng.field_0._28_4_ = (int)fVar127;
              fVar127 = local_1098[(long)pGVar36];
              h.Ng.field_0._36_4_ = (int)fVar127;
              h.Ng.field_0._32_4_ = (int)fVar127;
              h.Ng.field_0._40_4_ = (int)fVar127;
              h.Ng.field_0._44_4_ = (int)fVar127;
              h.u.field_0.v[1] = h.u.field_0.v[0];
              h.u.field_0.v[2] = h.u.field_0.v[0];
              h.u.field_0.v[3] = h.u.field_0.v[0];
              h.v.field_0.v[1] = h.v.field_0.v[0];
              h.v.field_0.v[2] = h.v.field_0.v[0];
              h.v.field_0.v[3] = h.v.field_0.v[0];
              h.geomID.field_0.i[1] = h.geomID.field_0.i[0];
              h.geomID.field_0.i[2] = h.geomID.field_0.i[0];
              h.geomID.field_0.i[3] = h.geomID.field_0.i[0];
              h.instID[0].field_0.i[0] = context->user->instID[0];
              h.instID[0].field_0.i[1] = h.instID[0].field_0.i[0];
              h.instID[0].field_0.i[2] = h.instID[0].field_0.i[0];
              h.instID[0].field_0.i[3] = h.instID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
              h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
              h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
              uVar42 = *(undefined4 *)(ray + k * 4 + 0x80);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10c8 + (long)pGVar36 * 4);
              local_11c8 = *local_1180;
              uStack_11c0 = local_1180[1];
              args.valid = (int *)&local_11c8;
              args.geometryUserPtr = pGVar30->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)&h;
              args.N = 4;
              local_11b0 = lVar31;
              local_11a8 = uVar37;
              local_11a0 = uVar34;
              local_1198 = uVar33;
              local_1190 = pSVar39;
              args.ray = (RTCRayN *)ray;
              if (pGVar30->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar30->intersectionFilterN)(&args);
              }
              auVar23._8_8_ = uStack_11c0;
              auVar23._0_8_ = local_11c8;
              if (auVar23 == (undefined1  [16])0x0) {
                auVar64._8_4_ = 0xffffffff;
                auVar64._0_8_ = 0xffffffffffffffff;
                auVar64._12_4_ = 0xffffffff;
                auVar64 = auVar64 ^ _DAT_01febe20;
              }
              else {
                p_Var17 = context->args->filter;
                if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar30->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var17)(&args);
                }
                auVar24._8_8_ = uStack_11c0;
                auVar24._0_8_ = local_11c8;
                auVar56._0_4_ = -(uint)((int)local_11c8 == 0);
                auVar56._4_4_ = -(uint)((int)((ulong)local_11c8 >> 0x20) == 0);
                auVar56._8_4_ = -(uint)((int)uStack_11c0 == 0);
                auVar56._12_4_ = -(uint)((int)((ulong)uStack_11c0 >> 0x20) == 0);
                auVar64 = auVar56 ^ _DAT_01febe20;
                if (auVar24 != (undefined1  [16])0x0) {
                  auVar62 = blendvps(*(undefined1 (*) [16])args.hit,
                                     *(undefined1 (*) [16])(args.ray + 0xc0),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar62;
                  auVar62 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                     *(undefined1 (*) [16])(args.ray + 0xd0),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar62;
                  auVar62 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                     *(undefined1 (*) [16])(args.ray + 0xe0),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar62;
                  auVar62 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                     *(undefined1 (*) [16])(args.ray + 0xf0),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar62;
                  auVar62 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                     *(undefined1 (*) [16])(args.ray + 0x100),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar62;
                  auVar62 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                     *(undefined1 (*) [16])(args.ray + 0x110),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar62;
                  auVar62 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                     *(undefined1 (*) [16])(args.ray + 0x120),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar62;
                  auVar62 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                     *(undefined1 (*) [16])(args.ray + 0x130),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar62;
                  auVar62 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                     *(undefined1 (*) [16])(args.ray + 0x140),auVar56);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar62;
                }
              }
              if ((_DAT_01fecb20 & auVar64) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar42;
              }
              valid.field_0.v[(long)pGVar36] = 0.0;
              fVar127 = *(float *)(ray + k * 4 + 0x80);
              valid.field_0.i[1] = -(uint)(local_1088._4_4_ <= fVar127) & valid.field_0.i[1];
              valid.field_0.i[0] = -(uint)(local_1088._0_4_ <= fVar127) & valid.field_0.i[0];
              valid.field_0.i[2] = -(uint)(local_1088._8_4_ <= fVar127) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(local_1088._12_4_ <= fVar127) & valid.field_0.i[3];
              pGVar30 = pGVar36;
              lVar31 = local_11b0;
              uVar33 = local_1198;
              uVar34 = local_11a0;
              uVar37 = local_11a8;
              pSVar39 = local_1190;
              auVar92 = local_1088;
            }
            uVar27 = movmskps((int)pGVar30,(undefined1  [16])valid.field_0);
            if (uVar27 == 0) goto LAB_0027361a;
            auVar71 = blendvps(_DAT_01feb9f0,auVar92,(undefined1  [16])valid.field_0);
            auVar84._4_4_ = auVar71._0_4_;
            auVar84._0_4_ = auVar71._4_4_;
            auVar84._8_4_ = auVar71._12_4_;
            auVar84._12_4_ = auVar71._8_4_;
            auVar62 = minps(auVar84,auVar71);
            auVar65._0_8_ = auVar62._8_8_;
            auVar65._8_4_ = auVar62._0_4_;
            auVar65._12_4_ = auVar62._4_4_;
            auVar62 = minps(auVar65,auVar62);
            auVar66._0_8_ =
                 CONCAT44(-(uint)(auVar62._4_4_ == auVar71._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar62._0_4_ == auVar71._0_4_) & valid.field_0._0_4_);
            auVar66._8_4_ = -(uint)(auVar62._8_4_ == auVar71._8_4_) & valid.field_0._8_4_;
            auVar66._12_4_ = -(uint)(auVar62._12_4_ == auVar71._12_4_) & valid.field_0._12_4_;
            iVar28 = movmskps(uVar27,auVar66);
            aVar57 = valid.field_0;
            if (iVar28 != 0) {
              aVar57.i[2] = auVar66._8_4_;
              aVar57._0_8_ = auVar66._0_8_;
              aVar57.i[3] = auVar66._12_4_;
            }
            uVar42 = movmskps(iVar28,(undefined1  [16])aVar57);
            uVar35 = CONCAT44((int)((ulong)pGVar30 >> 0x20),uVar42);
            pGVar36 = (Geometry *)0x0;
            if (uVar35 != 0) {
              for (; (uVar35 >> (long)pGVar36 & 1) == 0;
                  pGVar36 = (Geometry *)((long)&(pGVar36->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
            goto LAB_00273766;
          }
        }
LAB_0027361a:
        lVar41 = lVar41 + 1;
      } while (lVar41 != lVar31);
    }
    uVar42 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar62._4_4_ = uVar42;
    auVar62._0_4_ = uVar42;
    auVar62._8_4_ = uVar42;
    auVar62._12_4_ = uVar42;
    fVar127 = local_1018;
    fVar111 = fStack_1014;
    fVar121 = fStack_1010;
    fVar128 = fStack_100c;
    fVar45 = local_1028;
    fVar58 = fStack_1024;
    fVar59 = fStack_1020;
    fVar60 = fStack_101c;
    fVar61 = local_1038;
    fVar67 = fStack_1034;
    fVar68 = fStack_1030;
    fVar69 = fStack_102c;
    fVar70 = local_1048;
    fVar77 = fStack_1044;
    fVar78 = fStack_1040;
    fVar79 = fStack_103c;
    fVar80 = local_1058;
    fVar85 = fStack_1054;
    fVar86 = fStack_1050;
    fVar87 = fStack_104c;
    fVar98 = local_1068;
    fVar102 = fStack_1064;
    fVar104 = fStack_1060;
    fVar106 = fStack_105c;
    iVar28 = local_1078;
    iVar139 = iStack_1074;
    iVar140 = iStack_1070;
    iVar141 = iStack_106c;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }